

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<kj::Exception::Detail>::removeLast(ArrayBuilder<kj::Exception::Detail> *this)

{
  RemoveConst<kj::Exception::Detail> *pRVar1;
  ArrayBuilder<kj::Exception::Detail> *this_local;
  
  if (this->ptr < this->pos) {
    pRVar1 = this->pos;
    this->pos = pRVar1 + -1;
    dtor<kj::Exception::Detail>(pRVar1 + -1);
    return;
  }
  kj::_::inlineRequireFailure
            ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array.h"
             ,0x1b3,"pos > ptr","\"No elements present to remove.\"",
             "No elements present to remove.");
}

Assistant:

void removeLast() {
    KJ_IREQUIRE(pos > ptr, "No elements present to remove.");
    kj::dtor(*--pos);
  }